

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

uint * Kit_DsdTruthComputeTwo
                 (Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp,int iVar,uint *pTruthDec)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined2 uVar4;
  uint uVar5;
  Vec_Ptr_t *pVVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  uint *puVar10;
  long lVar11;
  ulong uVar12;
  
  if (uSupp == 0) {
    __assert_fail("uSupp > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x405,
                  "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
                 );
  }
  if (p->nVars < (int)(uint)pNtk->nVars) {
    __assert_fail("pNtk->nVars <= p->nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitDsd.c"
                  ,0x406,
                  "unsigned int *Kit_DsdTruthComputeTwo(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int, int, unsigned int *)"
                 );
  }
  uVar9 = Kit_DsdGetSupports(pNtk);
  if ((uVar9 & uSupp) == 0) {
    uVar3 = pNtk->nVars;
    uVar9 = 1 << ((char)uVar3 - 5U & 0x1f);
    if ((ushort)uVar3 < 6) {
      uVar9 = 1;
    }
    if (0 < (int)uVar9) {
      memset(pTruthDec,0,(ulong)uVar9 << 2);
    }
    puVar10 = Kit_DsdTruthCompute(p,pNtk);
    return puVar10;
  }
  if ((uVar9 & uSupp) == uVar9) {
    puVar10 = Kit_DsdTruthCompute(p,pNtk);
    uVar2 = pNtk->nVars;
    uVar9 = 1 << ((char)uVar2 - 5U & 0x1f);
    if ((ushort)uVar2 < 6) {
      uVar9 = 1;
    }
    if (0 < (int)uVar9) {
      lVar11 = (ulong)uVar9 + 1;
      do {
        pTruthDec[lVar11 + -2] = puVar10[lVar11 + -2];
        lVar11 = lVar11 + -1;
      } while (1 < lVar11);
    }
    if (iVar < 5) {
      if (0 < (int)uVar9) {
        uVar5 = (&DAT_00945d60)[iVar];
        uVar12 = 0;
        do {
          puVar10[uVar12] = uVar5;
          uVar12 = uVar12 + 1;
        } while (uVar9 != uVar12);
      }
    }
    else if (0 < (int)uVar9) {
      uVar12 = 0;
      do {
        puVar10[uVar12] = -(uint)((1 << ((char)iVar - 5U & 0x1f) & (uint)uVar12) != 0);
        uVar12 = uVar12 + 1;
      } while (uVar9 != uVar12);
    }
  }
  else {
    uVar1 = pNtk->nVars;
    if ((ulong)uVar1 != 0) {
      pVVar6 = p->vTtNodes;
      uVar12 = 0;
      do {
        if (((long)pVVar6->nSize <= (long)uVar12) || ((long)p->vTtElems->nSize <= (long)uVar12)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar9 = 1 << ((char)p->nVars - 5U & 0x1f);
        if (p->nVars < 6) {
          uVar9 = 1;
        }
        if (0 < (int)uVar9) {
          pvVar7 = pVVar6->pArray[uVar12];
          pvVar8 = p->vTtElems->pArray[uVar12];
          lVar11 = (ulong)uVar9 + 1;
          do {
            *(undefined4 *)((long)pvVar7 + lVar11 * 4 + -8) =
                 *(undefined4 *)((long)pvVar8 + lVar11 * 4 + -8);
            lVar11 = lVar11 + -1;
          } while (1 < lVar11);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar1);
    }
    puVar10 = Kit_DsdTruthComputeNodeTwo_rec(p,pNtk,(uint)(pNtk->Root >> 1),uSupp,iVar,pTruthDec);
    if ((pNtk->Root & 1) != 0) {
      uVar4 = pNtk->nVars;
      uVar9 = 1 << ((char)uVar4 - 5U & 0x1f);
      if ((ushort)uVar4 < 6) {
        uVar9 = 1;
      }
      if (0 < (int)uVar9) {
        lVar11 = (ulong)uVar9 + 1;
        do {
          puVar10[lVar11 + -2] = ~puVar10[lVar11 + -2];
          lVar11 = lVar11 + -1;
        } while (1 < lVar11);
      }
    }
  }
  return puVar10;
}

Assistant:

unsigned * Kit_DsdTruthComputeTwo( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp, int iVar, unsigned * pTruthDec )
{
    unsigned * pTruthRes, uSuppAll;
    int i;
    assert( uSupp > 0 );
    assert( pNtk->nVars <= p->nVars );
    // compute support of all nodes
    uSuppAll = Kit_DsdGetSupports( pNtk );
    // consider special case - there is no overlap
    if ( (uSupp & uSuppAll) == 0 )
    {
        Kit_TruthClear( pTruthDec, pNtk->nVars );
        return Kit_DsdTruthCompute( p, pNtk );
    }
    // consider special case - support is fully contained
    if ( (uSupp & uSuppAll) == uSuppAll )
    {
        pTruthRes = Kit_DsdTruthCompute( p, pNtk );
        Kit_TruthCopy( pTruthDec, pTruthRes, pNtk->nVars );
        Kit_TruthIthVar( pTruthRes, pNtk->nVars, iVar );
        return pTruthRes;
    }
    // assign elementary truth tables
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeTwo_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp, iVar, pTruthDec );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}